

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3<float> pbrt::Cross<float>(Vector3<float> *v1,Normal3<float> *v2)

{
  float fVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3<float> VVar10;
  
  uVar2._0_4_ = (v1->super_Tuple3<pbrt::Vector3,_float>).y;
  uVar2._4_4_ = (v1->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar2;
  fVar1 = (v2->super_Tuple3<pbrt::Normal3,_float>).x;
  uVar3._0_4_ = (v2->super_Tuple3<pbrt::Normal3,_float>).y;
  uVar3._4_4_ = (v2->super_Tuple3<pbrt::Normal3,_float>).z;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar6 = ZEXT416((uint)(v1->super_Tuple3<pbrt::Vector3,_float>).x);
  auVar4 = vpermt2ps_avx512vl(auVar7,_DAT_00493140,auVar6);
  auVar5 = vpermi2ps_avx512vl(_DAT_00493140,auVar8,ZEXT416((uint)fVar1));
  auVar9._0_4_ = (float)(undefined4)uVar3 * auVar4._0_4_;
  auVar9._4_4_ = (float)uVar3._4_4_ * auVar4._4_4_;
  auVar9._8_4_ = auVar4._8_4_ * 0.0;
  auVar9._12_4_ = auVar4._12_4_ * 0.0;
  auVar5 = vfmsub213ps_fma(auVar5,auVar7,auVar9);
  auVar9 = vfnmadd213ps_fma(auVar4,auVar8,auVar9);
  auVar4 = vfmsub213ss_fma(auVar8,auVar6,ZEXT416((uint)((float)(undefined4)uVar2 * fVar1)));
  auVar6 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),auVar7,
                            ZEXT416((uint)((float)(undefined4)uVar2 * fVar1)));
  VVar10.super_Tuple3<pbrt::Vector3,_float>.x = auVar5._0_4_ + auVar9._0_4_;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.y = auVar5._4_4_ + auVar9._4_4_;
  VVar10.super_Tuple3<pbrt::Vector3,_float>.z = auVar4._0_4_ + auVar6._0_4_;
  return (Vector3<float>)VVar10.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU inline Vector3<T> Cross(const Vector3<T> &v1, const Normal3<T> &v2) {
    DCHECK(!v1.HasNaN() && !v2.HasNaN());
    return {DifferenceOfProducts(v1.y, v2.z, v1.z, v2.y),
            DifferenceOfProducts(v1.z, v2.x, v1.x, v2.z),
            DifferenceOfProducts(v1.x, v2.y, v1.y, v2.x)};
}